

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-ncurses.cpp
# Opt level: O1

void ImTui_ImplNcurses_Shutdown(void)

{
  TScreen *pTVar1;
  
  puts("\x1b[?1003l");
  endwin();
  pTVar1 = g_screen;
  if (g_screen != (TScreen *)0x0) {
    if (g_screen->data != (TCell *)0x0) {
      operator_delete__(g_screen->data);
    }
    operator_delete(pTVar1);
  }
  g_screen = (TScreen *)0x0;
  return;
}

Assistant:

void ImTui_ImplNcurses_Shutdown() {
    // ref #11 : https://github.com/ggerganov/imtui/issues/11
    printf("\033[?1003l\n"); // Disable mouse movement events, as l = low

    endwin();

    if (g_screen) {
        delete g_screen;
    }

    g_screen = nullptr;
}